

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

HttpClient * __thiscall
kj::anon_unknown_36::NetworkHttpClient::getClient(NetworkHttpClient *this,Url *parsed)

{
  size_t sVar1;
  PromiseArena *pPVar2;
  Detail *pDVar3;
  Fault node;
  NetworkHttpClient *pNVar4;
  undefined8 uVar5;
  Maybe<kj::HttpClientErrorHandler_&> MVar6;
  HttpHeaderTable *pHVar7;
  byte bVar8;
  int iVar9;
  void *pvVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  _Base_ptr p_Var13;
  char cVar14;
  size_t __n;
  _Rb_tree_node_base *p_Var15;
  undefined8 unaff_RBP;
  char *__s2;
  Network *pNVar16;
  _Link_type __p;
  undefined8 uVar17;
  _Base_ptr p_Var18;
  PromiseNode *ptrCopy;
  _Base_ptr p_Var19;
  Exception *this_00;
  _Rb_tree_node_base *p_Var20;
  bool bVar21;
  Fault f_1;
  Fault f;
  bool _kjCondition;
  Fault local_d0;
  _Rb_tree_node_base *local_c8;
  NetworkHttpClient *local_c0;
  undefined1 local_b8 [64];
  Maybe<kj::HttpClientErrorHandler_&> local_78;
  HttpHeaderTable *pHStack_70;
  Maybe<kj::WebSocketErrorHandler_&> local_68;
  Maybe<kj::SecureNetworkWrapper_&> local_60;
  _Base_ptr local_58;
  _Base_ptr local_48;
  char local_40;
  char local_34;
  
  sVar1 = (parsed->scheme).content.size_;
  __n = sVar1 + (sVar1 == 0);
  if (sVar1 == 6) {
    iVar9 = bcmp((parsed->scheme).content.ptr,"https",__n);
    _local_34 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),iVar9 == 0);
  }
  else {
    _local_34 = 0;
  }
  if (sVar1 == 5) {
    iVar9 = bcmp((parsed->scheme).content.ptr,"http",__n);
    bVar21 = iVar9 == 0;
  }
  else {
    bVar21 = false;
  }
  bVar8 = bVar21 | (byte)_local_34;
  local_78.ptr._0_1_ = bVar8;
  if (bVar8 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
              ((Fault *)local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x18fc,FAILED,"isHttp || isHttps","_kjCondition,",(bool *)(local_b8 + 0x40));
    kj::_::Debug::Fault::fatal((Fault *)local_b8);
  }
  local_b8._56_8_ = &this->httpHosts;
  if ((byte)_local_34 != 0) {
    local_b8._56_8_ = &this->httpsHosts;
  }
  sVar1 = (parsed->host).content.size_;
  if (sVar1 == 0) {
    __s2 = "";
  }
  else {
    __s2 = (parsed->host).content.ptr;
  }
  p_Var19 = (_Base_ptr)(sVar1 + (sVar1 == 0));
  p_Var15 = (_Rb_tree_node_base *)&((_Base_ptr)local_b8._56_8_)->_M_parent;
  local_c8 = p_Var15;
  local_c0 = this;
  for (p_Var11 = ((_Base_ptr)local_b8._56_8_)->_M_left; p_Var11 != (_Rb_tree_node_base *)0x0;
      p_Var11 = (&p_Var11->_M_left)[bVar21]) {
    p_Var18 = p_Var11[1]._M_parent;
    p_Var13 = p_Var18;
    if (p_Var18 >= p_Var19) {
      p_Var13 = p_Var19;
    }
    iVar9 = memcmp(*(void **)(p_Var11 + 1),__s2,(size_t)p_Var13);
    bVar21 = iVar9 < 0;
    if (iVar9 == 0) {
      bVar21 = p_Var18 < p_Var19;
    }
    if (bVar21 == false) {
      p_Var15 = p_Var11;
    }
  }
  p_Var18 = local_c8;
  if (p_Var15 != local_c8) {
    p_Var18 = p_Var15[1]._M_parent;
    p_Var13 = p_Var18;
    if (p_Var19 < p_Var18) {
      p_Var13 = p_Var19;
    }
    iVar9 = memcmp(__s2,*(void **)(p_Var15 + 1),(size_t)p_Var13);
    bVar21 = iVar9 < 0;
    if (iVar9 == 0) {
      bVar21 = p_Var19 < p_Var18;
    }
    p_Var18 = p_Var15;
    if (bVar21) {
      p_Var18 = local_c8;
    }
  }
  if (p_Var18 != local_c8) goto LAB_003c7c52;
  if (local_34 == '\0') {
    pNVar16 = local_c0->network;
    uVar17 = 0x50;
  }
  else {
    pNVar16 = (local_c0->tlsNetwork).ptr;
    uVar17 = 0x1bb;
    if (pNVar16 == (Network *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                ((Fault *)local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x190e,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support HTTPS\""
                 ,(char (*) [38])"this HttpClient doesn\'t support HTTPS");
      kj::_::Debug::Fault::fatal((Fault *)local_b8);
    }
  }
  (**pNVar16->_vptr_Network)(local_b8,pNVar16,__s2,p_Var19,uVar17);
  uVar17 = local_b8._0_8_;
  pPVar2 = *(PromiseArena **)(local_b8._0_8_ + 8);
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_b8._0_8_ - (long)pPVar2) < 0x28) {
    pvVar10 = operator_new(0x400);
    pNVar4 = local_c0;
    this_00 = (Exception *)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_b8,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6418:17)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_006405b8;
    *(NetworkHttpClient **)((long)pvVar10 + 0x3f8) = pNVar4;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    *(PromiseArena **)(local_b8._0_8_ + 8) = (PromiseArena *)0x0;
    this_00 = (Exception *)(local_b8._0_8_ + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(OwnPromiseNode *)local_b8,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6418:17)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)(uVar17 + -0x28) = &PTR_destroy_006405b8;
    *(NetworkHttpClient **)(uVar17 + -8) = local_c0;
    ((PromiseArenaMember *)(uVar17 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  uVar17 = local_b8._0_8_;
  if ((Exception *)local_b8._0_8_ != (Exception *)0x0) {
    local_b8._0_8_ = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  local_78.ptr = (HttpClientErrorHandler *)(parsed->host).content.ptr;
  pHStack_70 = (HttpHeaderTable *)(parsed->host).content.size_;
  local_68.ptr = (WebSocketErrorHandler *)(parsed->host).content.disposer;
  (parsed->host).content.ptr = (char *)0x0;
  (parsed->host).content.size_ = 0;
  p_Var19 = (_Base_ptr)operator_new(0x30);
  *(undefined ***)p_Var19 = &PTR_request_00640610;
  pDVar3 = (Detail *)(this_00->ownFile).content.size_;
  local_d0.exception = this_00;
  if (pDVar3 == (Detail *)0x0 || (ulong)((long)this_00 - (long)pDVar3) < 0x28) {
    pvVar10 = operator_new(0x400);
    p_Var18 = (_Base_ptr)((long)pvVar10 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)p_Var18,(OwnPromiseNode *)&local_d0,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6184:30)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar10 + 0x3d8) = &PTR_destroy_00640650;
    *(_Base_ptr *)((long)pvVar10 + 0x3f8) = p_Var19;
    *(void **)((long)pvVar10 + 0x3e0) = pvVar10;
  }
  else {
    (this_00->ownFile).content.size_ = 0;
    p_Var18 = (_Base_ptr)&this_00[-1].traceCount;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)p_Var18,(OwnPromiseNode *)&local_d0,
               kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6184:30)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)&this_00[-1].traceCount = &PTR_destroy_00640650;
    this_00[-1].details.builder.disposer = (ArrayDisposer *)p_Var19;
    this_00[-1].details.builder.ptr = pDVar3;
  }
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_b8._8_8_ = "PromiseNetworkAddressHttpClient";
  local_b8._16_8_ = (Timer *)0x1100001828;
  local_48 = p_Var18;
  Promise<void>::fork((Promise<void> *)&p_Var19->_M_parent);
  p_Var18 = local_48;
  if (local_48 != (_Base_ptr)0x0) {
    local_48 = (_Base_ptr)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)p_Var18);
  }
  node.exception = local_d0.exception;
  p_Var19->_M_right = (_Base_ptr)0x0;
  *(undefined8 *)(p_Var19 + 1) = 0;
  *(undefined1 *)&p_Var19[1]._M_parent = 0;
  local_60.ptr = (SecureNetworkWrapper *)
                 &kj::_::HeapDisposer<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::
                  instance;
  local_58 = p_Var19;
  if (local_d0.exception != (Exception *)0x0) {
    local_d0.exception = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
  }
  local_b8._0_8_ = (Exception *)0x4d2b65;
  if (pHStack_70 != (HttpHeaderTable *)0x0) {
    local_b8._0_8_ = local_78.ptr;
  }
  __p = (_Link_type)
        ((long)&(pHStack_70->namesById).builder.ptr + (ulong)(pHStack_70 == (HttpHeaderTable *)0x0))
  ;
  local_b8._16_8_ = local_78.ptr;
  local_b8._24_8_ = pHStack_70;
  local_b8._32_8_ = local_68.ptr;
  local_78.ptr = (HttpClientErrorHandler *)0x0;
  pHStack_70 = (HttpHeaderTable *)0x0;
  local_b8._40_8_ = local_60.ptr;
  local_b8._48_8_ = local_58;
  local_58 = (_Base_ptr)0x0;
  local_b8._8_8_ = __p;
  p_Var11 = (_Rb_tree_node_base *)operator_new(0x58);
  *(undefined8 *)(p_Var11 + 1) = local_b8._0_8_;
  p_Var11[1]._M_parent = (_Base_ptr)local_b8._8_8_;
  p_Var11[1]._M_left = (_Base_ptr)local_b8._16_8_;
  p_Var11[1]._M_right = (_Base_ptr)local_b8._24_8_;
  *(undefined8 *)(p_Var11 + 2) = local_b8._32_8_;
  local_b8._16_8_ = (Timer *)0x0;
  local_b8._24_8_ = (HttpHeaderTable *)0x0;
  p_Var11[2]._M_parent = (_Base_ptr)local_b8._40_8_;
  p_Var11[2]._M_left = (_Base_ptr)local_b8._48_8_;
  local_b8._48_8_ = (long *)0x0;
  p_Var15 = *(_Base_ptr *)(local_b8._56_8_ + 0x10);
  if (p_Var15 == (_Rb_tree_node_base *)0x0) {
    bVar21 = true;
    p_Var20 = local_c8;
  }
  else {
    pvVar10 = *(void **)(p_Var11 + 1);
    p_Var19 = p_Var11[1]._M_parent;
    do {
      p_Var20 = p_Var15;
      __p = *(_Link_type *)(p_Var20 + 1);
      p_Var18 = p_Var20[1]._M_parent;
      p_Var13 = p_Var18;
      if (p_Var19 < p_Var18) {
        p_Var13 = p_Var19;
      }
      iVar9 = memcmp(pvVar10,__p,(size_t)p_Var13);
      bVar21 = iVar9 < 0;
      if (iVar9 == 0) {
        bVar21 = p_Var19 < p_Var18;
      }
      p_Var15 = (&p_Var20->_M_left)[bVar21 ^ 1];
    } while (p_Var15 != (_Base_ptr)0x0);
  }
  p_Var12 = p_Var20;
  if (bVar21 == false) {
LAB_003c7a87:
    p_Var19 = p_Var12[1]._M_parent;
    __p = *(_Link_type *)(p_Var11 + 1);
    p_Var18 = p_Var11[1]._M_parent;
    p_Var13 = p_Var18;
    if (p_Var19 < p_Var18) {
      p_Var13 = p_Var19;
    }
    iVar9 = memcmp(*(void **)(p_Var12 + 1),__p,(size_t)p_Var13);
    bVar21 = iVar9 < 0;
    if (iVar9 == 0) {
      bVar21 = p_Var19 < p_Var18;
    }
    if (!bVar21) {
      p_Var15 = p_Var12;
      p_Var20 = (_Rb_tree_node_base *)0x0;
    }
  }
  else if (p_Var20 != *(_Base_ptr *)(local_b8._56_8_ + 0x18)) {
    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var20);
    goto LAB_003c7a87;
  }
  if (p_Var20 == (_Rb_tree_node_base *)0x0) {
    std::
    _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
    ::_M_drop_node((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                    *)p_Var11,__p);
    cVar14 = '\0';
  }
  else {
    cVar14 = '\x01';
    bVar21 = true;
    if ((p_Var15 == (_Rb_tree_node_base *)0x0) && (bVar21 = true, local_c8 != p_Var20)) {
      p_Var19 = p_Var11[1]._M_parent;
      p_Var18 = p_Var20[1]._M_parent;
      p_Var13 = p_Var18;
      if (p_Var19 < p_Var18) {
        p_Var13 = p_Var19;
      }
      iVar9 = memcmp(*(void **)(p_Var11 + 1),*(void **)(p_Var20 + 1),(size_t)p_Var13);
      bVar21 = iVar9 < 0;
      if (iVar9 == 0) {
        bVar21 = p_Var19 < p_Var18;
      }
    }
    std::_Rb_tree_insert_and_rebalance(bVar21,p_Var11,p_Var20,local_c8);
    *(_Base_ptr *)(local_b8._56_8_ + 0x28) =
         (_Base_ptr)((long)&(*(_Base_ptr *)(local_b8._56_8_ + 0x28))->_M_color + 1);
    p_Var15 = p_Var11;
  }
  uVar17 = local_b8._48_8_;
  local_48 = p_Var15;
  local_40 = cVar14;
  if ((long *)local_b8._48_8_ != (long *)0x0) {
    local_b8._48_8_ = (long *)0x0;
    (***(_func_int ***)local_b8._40_8_)(local_b8._40_8_,uVar17 + *(long *)(*(long *)uVar17 + -0x10))
    ;
  }
  uVar5 = local_b8._24_8_;
  uVar17 = local_b8._16_8_;
  pNVar4 = local_c0;
  if ((Timer *)local_b8._16_8_ != (Timer *)0x0) {
    local_b8._16_8_ = (Timer *)0x0;
    local_b8._24_8_ = (HttpHeaderTable *)0x0;
    (***(_func_int ***)local_b8._32_8_)(local_b8._32_8_,uVar17,1,uVar5,uVar5,0);
  }
  p_Var18 = local_48;
  local_b8._0_8_ = &stack0xffffffffffffffc0;
  if (local_40 == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x191e,FAILED,"insertResult.second","_kjCondition,",
               (DebugExpression<bool_&> *)local_b8);
    kj::_::Debug::Fault::fatal(&local_d0);
  }
  handleCleanup((NetworkHttpClient *)local_b8,
                (map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 *)pNVar4,(iterator)local_b8._56_8_);
  TaskSet::add(&pNVar4->tasks,(Promise<void> *)local_b8);
  uVar17 = local_b8._0_8_;
  if ((Exception *)local_b8._0_8_ != (Exception *)0x0) {
    local_b8._0_8_ = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  p_Var19 = local_58;
  if (local_58 != (_Base_ptr)0x0) {
    local_58 = (_Base_ptr)0x0;
    (**(local_60.ptr)->_vptr_SecureNetworkWrapper)
              (local_60.ptr,(long)p_Var19 + *(long *)(*(long *)p_Var19 + -0x10));
  }
  pHVar7 = pHStack_70;
  MVar6.ptr = local_78.ptr;
  if (local_78.ptr != (HttpClientErrorHandler *)0x0) {
    local_78.ptr = (HttpClientErrorHandler *)0x0;
    pHStack_70 = (HttpHeaderTable *)0x0;
    (**(local_68.ptr)->_vptr_WebSocketErrorHandler)(local_68.ptr,MVar6.ptr,1,pHVar7,pHVar7,0);
  }
LAB_003c7c52:
  return (HttpClient *)p_Var18[2]._M_left;
}

Assistant:

HttpClient& getClient(kj::Url& parsed) {
    bool isHttps = parsed.scheme == "https";
    bool isHttp = parsed.scheme == "http";
    KJ_REQUIRE(isHttp || isHttps);

    auto& hosts = isHttps ? httpsHosts : httpHosts;

    // Look for a cached client for this host.
    // TODO(perf): It would be nice to recognize when different hosts have the same address and
    //   reuse the same connection pool, but:
    //   - We'd need a reliable way to compare NetworkAddresses, e.g. .equals() and .hashCode().
    //     It's very Java... ick.
    //   - Correctly handling TLS would be tricky: we'd need to verify that the new hostname is
    //     on the certificate. When SNI is in use we might have to request an additional
    //     certificate (is that possible?).
    auto iter = hosts.find(parsed.host);

    if (iter == hosts.end()) {
      // Need to open a new connection.
      kj::Network* networkToUse = &network;
      if (isHttps) {
        networkToUse = &KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support HTTPS");
      }

      auto promise = networkToUse->parseAddress(parsed.host, isHttps ? 443 : 80)
          .then([this](kj::Own<kj::NetworkAddress> addr) {
        return kj::heap<NetworkAddressHttpClient>(
            timer, responseHeaderTable, kj::mv(addr), settings);
      });

      Host host {
        kj::mv(parsed.host),
        kj::heap<PromiseNetworkAddressHttpClient>(kj::mv(promise))
      };
      kj::StringPtr nameRef = host.name;

      auto insertResult = hosts.insert(std::make_pair(nameRef, kj::mv(host)));
      KJ_ASSERT(insertResult.second);
      iter = insertResult.first;

      tasks.add(handleCleanup(hosts, iter));
    }

    return *iter->second.client;
  }